

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O1

void __thiscall
sglr::ReferenceContext::uniform1iv(ReferenceContext *this,deInt32 location,deInt32 count,deInt32 *v)

{
  ShaderProgram *pSVar1;
  pointer pUVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (this->m_currentProgram != (ShaderProgramObjectContainer *)0x0) {
    if (location == -1) {
      return;
    }
    if (-1 < location) {
      pSVar1 = this->m_currentProgram->m_program;
      uVar4 = (ulong)(uint)location;
      pUVar2 = (pSVar1->m_uniforms).
               super__Vector_base<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar5 = ((long)(pSVar1->m_uniforms).
                     super__Vector_base<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)pUVar2 >> 4) *
              0x6db6db6db6db6db7;
      if ((uVar4 <= uVar5 && uVar5 - uVar4 != 0) && (count == 1)) {
        uVar3 = pUVar2[uVar4].type - TYPE_INT;
        if ((uVar3 < 0x27) &&
           (((0x76ec076000U >> ((ulong)uVar3 & 0x3f) & 1) != 0 || ((ulong)uVar3 == 0)))) {
          pUVar2[uVar4].value.i = *v;
          return;
        }
      }
    }
  }
  if (this->m_lastError != 0) {
    return;
  }
  this->m_lastError = 0x502;
  return;
}

Assistant:

void ReferenceContext::uniform1iv (deInt32 location, deInt32 count, const deInt32* v)
{
	RC_IF_ERROR(m_currentProgram == DE_NULL, GL_INVALID_OPERATION, RC_RET_VOID);

	std::vector<sglr::UniformSlot>& uniforms = m_currentProgram->m_program->m_uniforms;

	if (location == -1)
		return;

	RC_IF_ERROR(location < 0 || (size_t)location >= uniforms.size(), GL_INVALID_OPERATION, RC_RET_VOID);
	RC_IF_ERROR(count != 1, GL_INVALID_OPERATION, RC_RET_VOID); // \todo [2013-12-13 pyry] Array uniforms.

	switch (uniforms[location].type)
	{
		case glu::TYPE_INT:		uniforms[location].value.i = *v;	return;

		// \note texture unit is stored to value
		case glu::TYPE_SAMPLER_2D:
		case glu::TYPE_UINT_SAMPLER_2D:
		case glu::TYPE_INT_SAMPLER_2D:
		case glu::TYPE_SAMPLER_CUBE:
		case glu::TYPE_UINT_SAMPLER_CUBE:
		case glu::TYPE_INT_SAMPLER_CUBE:
		case glu::TYPE_SAMPLER_2D_ARRAY:
		case glu::TYPE_UINT_SAMPLER_2D_ARRAY:
		case glu::TYPE_INT_SAMPLER_2D_ARRAY:
		case glu::TYPE_SAMPLER_3D:
		case glu::TYPE_UINT_SAMPLER_3D:
		case glu::TYPE_INT_SAMPLER_3D:
		case glu::TYPE_SAMPLER_CUBE_ARRAY:
		case glu::TYPE_UINT_SAMPLER_CUBE_ARRAY:
		case glu::TYPE_INT_SAMPLER_CUBE_ARRAY:
			uniforms[location].value.i = *v;
			return;

		default:
			setError(GL_INVALID_OPERATION);
			return;
	}
}